

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HLSL2GLSLConverterImpl.cpp
# Opt level: O0

void __thiscall
Diligent::HLSL2GLSLConverterImpl::ConversionStream::ProcessConstantBuffer
          (ConversionStream *this,iterator *Token)

{
  undefined8 uVar1;
  bool bVar2;
  bool bVar3;
  pointer pHVar4;
  Char *Message;
  char *pcVar5;
  pointer pHVar6;
  _List_iterator<Diligent::Parsing::HLSLTokenInfo> Args_1;
  char (*in_RCX) [37];
  char *Args_1_00;
  allocator local_259;
  string local_258;
  allocator local_231;
  string local_230;
  HLSLTokenInfo local_210;
  const_iterator local_1c0;
  _Self local_1b8;
  String local_1b0;
  undefined1 local_190 [8];
  string err_3;
  _List_iterator<Diligent::Parsing::HLSLTokenInfo> local_160;
  _List_iterator<Diligent::Parsing::HLSLTokenInfo> local_158;
  _List_node_base *local_150;
  String local_148;
  undefined1 local_128 [8];
  string err_2;
  _Self local_100;
  _List_node_base *local_f8;
  const_iterator local_f0;
  iterator local_e8;
  iterator CurrToken;
  String *CBufferName;
  undefined1 local_b0 [8];
  string err_1;
  undefined1 local_70 [8];
  string err;
  undefined1 local_38 [8];
  string msg;
  iterator *Token_local;
  ConversionStream *this_local;
  
  msg.field_2._8_8_ = Token;
  pHVar4 = std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator->(Token);
  if (pHVar4->Type != kw_cbuffer) {
    FormatString<char[26],char[37]>
              ((string *)local_38,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"Token->Type == TokenType::kw_cbuffer",in_RCX);
    Message = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (Message,"ProcessConstantBuffer",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
               ,0x395);
    std::__cxx11::string::~string((string *)local_38);
  }
  pcVar5 = "uniform";
  Args_1_00 = "layout(row_major) uniform";
  if ((this->m_bUseRowMajorMatrices & 1U) != 0) {
    pcVar5 = "layout(row_major) uniform";
  }
  pHVar4 = std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator->
                     ((_List_iterator<Diligent::Parsing::HLSLTokenInfo> *)msg.field_2._8_8_);
  std::__cxx11::string::operator=((string *)&pHVar4->Literal,pcVar5);
  std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator++
            ((_List_iterator<Diligent::Parsing::HLSLTokenInfo> *)msg.field_2._8_8_);
  uVar1 = msg.field_2._8_8_;
  err.field_2._8_8_ =
       std::__cxx11::
       list<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>::
       end(&this->m_Tokens);
  bVar2 = std::operator!=((_Self *)uVar1,(_Self *)((long)&err.field_2 + 8));
  if (((bVar2 ^ 0xffU) & 1) != 0) {
    FormatString<char[39]>
              ((string *)local_70,(char (*) [39])"Unexpected EOF after \"cbuffer\" keyword");
    PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
              ((String *)((long)&err_1.field_2 + 8),this,
               (_List_iterator<Diligent::Parsing::HLSLTokenInfo> *)msg.field_2._8_8_,4);
    Args_1_00 = (char *)0x39f;
    LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
              (false,"ProcessConstantBuffer",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
               ,0x39f,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70,
               (char (*) [2])0xe6c869,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)&err_1.field_2 + 8));
    std::__cxx11::string::~string((string *)(err_1.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)local_70);
  }
  pHVar4 = std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator->
                     ((_List_iterator<Diligent::Parsing::HLSLTokenInfo> *)msg.field_2._8_8_);
  if (pHVar4->Type != Identifier) {
    FormatString<char[44]>
              ((string *)local_b0,(char (*) [44])"Identifier expected after \"cbuffer\" keyword");
    PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
              ((String *)&CBufferName,this,
               (_List_iterator<Diligent::Parsing::HLSLTokenInfo> *)msg.field_2._8_8_,4);
    Args_1_00 = (char *)0x3a0;
    LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
              (false,"ProcessConstantBuffer",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
               ,0x3a0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b0,
               (char (*) [2])0xe6c869,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&CBufferName);
    std::__cxx11::string::~string((string *)&CBufferName);
    std::__cxx11::string::~string((string *)local_b0);
  }
  pHVar4 = std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator->
                     ((_List_iterator<Diligent::Parsing::HLSLTokenInfo> *)msg.field_2._8_8_);
  std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator++
            ((_List_iterator<Diligent::Parsing::HLSLTokenInfo> *)msg.field_2._8_8_);
  pHVar6 = std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator->
                     ((_List_iterator<Diligent::Parsing::HLSLTokenInfo> *)msg.field_2._8_8_);
  bVar2 = std::operator==(&pHVar6->Literal,":");
  if (bVar2) {
    while( true ) {
      uVar1 = msg.field_2._8_8_;
      CurrToken = std::__cxx11::
                  list<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>
                  ::end(&this->m_Tokens);
      bVar3 = std::operator!=((_Self *)uVar1,&CurrToken);
      Args_1_00 = (char *)CONCAT71((int7)((ulong)Args_1_00 >> 8),bVar3);
      bVar2 = false;
      if (bVar3) {
        pHVar6 = std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator->
                           ((_List_iterator<Diligent::Parsing::HLSLTokenInfo> *)msg.field_2._8_8_);
        bVar2 = pHVar6->Type != OpenBrace;
      }
      if (!bVar2) break;
      local_e8._M_node = *(_List_node_base **)msg.field_2._8_8_;
      std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator++
                ((_List_iterator<Diligent::Parsing::HLSLTokenInfo> *)msg.field_2._8_8_);
      std::_List_const_iterator<Diligent::Parsing::HLSLTokenInfo>::_List_const_iterator
                (&local_f0,&local_e8);
      local_f8 = (_List_node_base *)
                 std::__cxx11::
                 list<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>
                 ::erase(&this->m_Tokens,local_f0);
    }
  }
  while( true ) {
    uVar1 = msg.field_2._8_8_;
    local_100._M_node =
         (_List_node_base *)
         std::__cxx11::
         list<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>::
         end(&this->m_Tokens);
    bVar3 = std::operator!=((_Self *)uVar1,&local_100);
    Args_1_00 = (char *)CONCAT71((int7)((ulong)Args_1_00 >> 8),bVar3);
    bVar2 = false;
    if (bVar3) {
      pHVar6 = std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator->
                         ((_List_iterator<Diligent::Parsing::HLSLTokenInfo> *)msg.field_2._8_8_);
      bVar2 = pHVar6->Type != OpenBrace;
    }
    uVar1 = msg.field_2._8_8_;
    if (!bVar2) break;
    std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator++
              ((_List_iterator<Diligent::Parsing::HLSLTokenInfo> *)msg.field_2._8_8_);
  }
  err_2.field_2._8_8_ =
       std::__cxx11::
       list<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>::
       end(&this->m_Tokens);
  bVar2 = std::operator!=((_Self *)uVar1,(_Self *)((long)&err_2.field_2 + 8));
  if (((bVar2 ^ 0xffU) & 1) != 0) {
    FormatString<char[49],std::__cxx11::string>
              ((string *)local_128,(Diligent *)"Missing open brace in the definition of cbuffer ",
               (char (*) [49])&pHVar4->Literal,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)Args_1_00);
    PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
              (&local_148,this,(_List_iterator<Diligent::Parsing::HLSLTokenInfo> *)msg.field_2._8_8_
               ,4);
    LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
              (false,"ProcessConstantBuffer",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
               ,0x3bb,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_128
               ,(char (*) [2])0xe6c869,&local_148);
    std::__cxx11::string::~string((string *)&local_148);
    std::__cxx11::string::~string((string *)local_128);
  }
  local_158._M_node =
       (_List_node_base *)
       std::__cxx11::
       list<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>::
       begin(&this->m_Tokens);
  local_160._M_node =
       (_List_node_base *)
       std::__cxx11::
       list<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>::
       end(&this->m_Tokens);
  Args_1 = Parsing::FindMatchingBracket<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
                     (&local_158,&local_160,*(_List_node_base **)msg.field_2._8_8_);
  uVar1 = msg.field_2._8_8_;
  *(_List_node_base **)msg.field_2._8_8_ = Args_1._M_node;
  local_150 = Args_1._M_node;
  err_3.field_2._8_8_ =
       std::__cxx11::
       list<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>::
       end(&this->m_Tokens);
  bVar2 = std::operator!=((_Self *)uVar1,(_Self *)((long)&err_3.field_2 + 8));
  if (((bVar2 ^ 0xffU) & 1) != 0) {
    FormatString<char[62],std::__cxx11::string>
              ((string *)local_190,
               (Diligent *)"No matching closing brace found in the definition of cbuffer ",
               (char (*) [62])&pHVar4->Literal,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)Args_1._M_node);
    PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
              (&local_1b0,this,(_List_iterator<Diligent::Parsing::HLSLTokenInfo> *)msg.field_2._8_8_
               ,4);
    LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
              (false,"ProcessConstantBuffer",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
               ,0x3bf,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_190
               ,(char (*) [2])0xe6c869,&local_1b0);
    std::__cxx11::string::~string((string *)&local_1b0);
    std::__cxx11::string::~string((string *)local_190);
  }
  std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator++
            ((_List_iterator<Diligent::Parsing::HLSLTokenInfo> *)msg.field_2._8_8_);
  uVar1 = msg.field_2._8_8_;
  local_1b8._M_node =
       (_List_node_base *)
       std::__cxx11::
       list<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>::
       end(&this->m_Tokens);
  bVar3 = std::operator==((_Self *)uVar1,&local_1b8);
  bVar2 = true;
  if (!bVar3) {
    pHVar4 = std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator->
                       ((_List_iterator<Diligent::Parsing::HLSLTokenInfo> *)msg.field_2._8_8_);
    bVar2 = pHVar4->Type != Semicolon;
  }
  if (bVar2) {
    std::_List_const_iterator<Diligent::Parsing::HLSLTokenInfo>::_List_const_iterator
              (&local_1c0,(iterator *)msg.field_2._8_8_);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_230,";",&local_231);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_258,"",&local_259);
    Parsing::HLSLTokenInfo::HLSLTokenInfo
              (&local_210,Semicolon,&local_230,&local_258,0xffffffffffffffff);
    std::__cxx11::
    list<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>::
    insert(&this->m_Tokens,local_1c0,&local_210);
    Parsing::HLSLTokenInfo::~HLSLTokenInfo(&local_210);
    std::__cxx11::string::~string((string *)&local_258);
    std::allocator<char>::~allocator((allocator<char> *)&local_259);
    std::__cxx11::string::~string((string *)&local_230);
    std::allocator<char>::~allocator((allocator<char> *)&local_231);
  }
  return;
}

Assistant:

void HLSL2GLSLConverterImpl::ConversionStream::ProcessConstantBuffer(TokenListType::iterator& Token)
{
    VERIFY_EXPR(Token->Type == TokenType::kw_cbuffer);

    // Replace "cbuffer" with "uniform"
    Token->Literal = m_bUseRowMajorMatrices ?
        "layout(row_major) uniform" :
        "uniform";
    ++Token;
    // cbuffer CBufferName
    //         ^

    VERIFY_PARSER_STATE(Token, Token != m_Tokens.end(), "Unexpected EOF after \"cbuffer\" keyword");
    VERIFY_PARSER_STATE(Token, Token->Type == TokenType::Identifier, "Identifier expected after \"cbuffer\" keyword");
    const auto& CBufferName = Token->Literal;

    ++Token;
    // cbuffer CBufferName
    //                    ^
    if (Token->Literal == ":")
    {
        // cbuffer CBufferName : register(b0) {
        //                     ^

        // Remove register
        while (Token != m_Tokens.end() && Token->Type != TokenType::OpenBrace)
        {
            auto CurrToken = Token;
            ++Token;
            m_Tokens.erase(CurrToken);
        }
        // cbuffer CBufferName {
        //                     ^
    }

    while (Token != m_Tokens.end() && Token->Type != TokenType::OpenBrace)
        ++Token;
    // cbuffer CBufferName
    // {
    // ^
    VERIFY_PARSER_STATE(Token, Token != m_Tokens.end(), "Missing open brace in the definition of cbuffer ", CBufferName);

    // Find closing brace
    Token = Parsing::FindMatchingBracket(m_Tokens.begin(), m_Tokens.end(), Token);
    VERIFY_PARSER_STATE(Token, Token != m_Tokens.end(), "No matching closing brace found in the definition of cbuffer ", CBufferName);

    ++Token; // Skip closing brace
    // cbuffer CBufferName
    // {
    //    ...
    // }
    // int a
    // ^

    if (Token == m_Tokens.end() || Token->Type != TokenType::Semicolon)
    {
        m_Tokens.insert(Token, TokenInfo(TokenType::Semicolon, ";"));
        // cbuffer CBufferName
        // {
        //    ...
        // };
        // int a;
        // ^
    }
}